

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void convert_8x8_to_16x16(__m128i *in,__m128i *out)

{
  longlong lVar1;
  int iVar2;
  int src_index;
  int dst_index;
  int row_index;
  __m128i *out_local;
  __m128i *in_local;
  
  row_index = 0;
  dst_index = 0;
  src_index = 0;
  iVar2 = src_index;
  do {
    src_index = iVar2;
    lVar1 = in[src_index][1];
    out[dst_index][0] = in[src_index][0];
    out[dst_index][1] = lVar1;
    lVar1 = in[src_index + 1][1];
    out[dst_index + 1][0] = in[src_index + 1][0];
    out[dst_index + 1][1] = lVar1;
    lVar1 = in[src_index + 0x10][1];
    out[dst_index + 2][0] = in[src_index + 0x10][0];
    out[dst_index + 2][1] = lVar1;
    lVar1 = in[src_index + 0x11][1];
    out[dst_index + 3][0] = in[src_index + 0x11][0];
    out[dst_index + 3][1] = lVar1;
    dst_index = dst_index + 4;
    row_index = row_index + 1;
    iVar2 = src_index + 2;
  } while (row_index < 8);
  src_index = src_index + 0x12;
  do {
    lVar1 = in[src_index][1];
    out[dst_index][0] = in[src_index][0];
    out[dst_index][1] = lVar1;
    lVar1 = in[src_index + 1][1];
    out[dst_index + 1][0] = in[src_index + 1][0];
    out[dst_index + 1][1] = lVar1;
    lVar1 = in[src_index + 0x10][1];
    out[dst_index + 2][0] = in[src_index + 0x10][0];
    out[dst_index + 2][1] = lVar1;
    lVar1 = in[src_index + 0x11][1];
    out[dst_index + 3][0] = in[src_index + 0x11][0];
    out[dst_index + 3][1] = lVar1;
    dst_index = dst_index + 4;
    src_index = src_index + 2;
    row_index = row_index + 1;
  } while (row_index < 0x10);
  return;
}

Assistant:

static inline void convert_8x8_to_16x16(const __m128i *in, __m128i *out) {
  int row_index = 0;
  int dst_index = 0;
  int src_index = 0;

  // row 0, 1, .., 7
  do {
    out[dst_index] = in[src_index];
    out[dst_index + 1] = in[src_index + 1];
    out[dst_index + 2] = in[src_index + 16];
    out[dst_index + 3] = in[src_index + 17];
    dst_index += 4;
    src_index += 2;
    row_index += 1;
  } while (row_index < 8);

  // row 8, 9, ..., 15
  src_index += 16;
  do {
    out[dst_index] = in[src_index];
    out[dst_index + 1] = in[src_index + 1];
    out[dst_index + 2] = in[src_index + 16];
    out[dst_index + 3] = in[src_index + 17];
    dst_index += 4;
    src_index += 2;
    row_index += 1;
  } while (row_index < 16);
}